

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

bool google::protobuf::compiler::ApplyMapping
               (string_view filename,string_view old_prefix,string_view new_prefix,string *result)

{
  int iVar1;
  size_type __rlen_1;
  size_type sVar2;
  size_type __rlen;
  short *__s1;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  size_type __rlen_2;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  long local_48 [2];
  short *local_38;
  
  pcVar6 = new_prefix._M_str;
  sVar4 = new_prefix._M_len;
  uVar5 = old_prefix._M_len;
  __s1 = (short *)filename._M_str;
  uVar3 = filename._M_len;
  if (uVar5 == 0) {
    if (uVar3 == 2) {
      if (*__s1 == 0x2e2e) {
        return false;
      }
    }
    else if (2 < uVar3) {
      if ((char)__s1[1] == '/' && *__s1 == 0x2e2e) {
        return false;
      }
      if (*(char *)((long)__s1 + (uVar3 - 1)) == '.' &&
          *(short *)((long)__s1 + (uVar3 - 3)) == 0x2e2f) {
        return false;
      }
    }
    local_58._M_len = uVar3;
    local_58._M_str = (char *)__s1;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_58,"/../",0,4);
    if (sVar2 != 0xffffffffffffffff) {
      return false;
    }
    if ((uVar3 != 0) && ((char)*__s1 == '/')) {
      return false;
    }
    local_58._M_len = (size_t)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar6,pcVar6 + sVar4);
    std::__cxx11::string::operator=((string *)result,(string *)&local_58);
    if ((long *)local_58._M_len != local_48) {
      operator_delete((void *)local_58._M_len,local_48[0] + 1);
    }
    if (result->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)result);
    }
    local_58._M_len = (size_t)local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,__s1,(char *)(uVar3 + (long)__s1));
    std::__cxx11::string::_M_append((char *)result,local_58._M_len);
  }
  else {
    if (uVar3 < uVar5) {
      return false;
    }
    iVar1 = bcmp(__s1,old_prefix._M_str,uVar5);
    if (iVar1 != 0) {
      return false;
    }
    if (uVar3 == uVar5) {
      local_58._M_len = (size_t)local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar6,pcVar6 + sVar4);
      std::__cxx11::string::operator=((string *)result,(string *)&local_58);
      if ((long *)local_58._M_len == local_48) {
        return true;
      }
      goto LAB_001fbd00;
    }
    if (*(char *)((long)__s1 + uVar5) == '/') {
      uVar5 = (ulong)((int)old_prefix._M_len + 1);
    }
    else if (*(char *)((long)__s1 + (uVar5 - 1)) != '/') {
      return false;
    }
    if ((int)uVar5 == -1) {
      return false;
    }
    uVar5 = (ulong)(int)uVar5;
    local_58._M_len = uVar3 - uVar5;
    if (uVar3 < uVar5) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar5,uVar3);
    }
    local_58._M_str = (char *)(uVar5 + (long)__s1);
    if (local_58._M_len == 2) {
      if (*(short *)local_58._M_str == 0x2e2e) {
        return false;
      }
    }
    else if (2 < local_58._M_len) {
      if ((char)*(short *)((long)local_58._M_str + 2) == '/' && *(short *)local_58._M_str == 0x2e2e)
      {
        return false;
      }
      if (*(char *)((long)__s1 + (uVar3 - 1)) == '.' &&
          *(short *)((long)__s1 + (uVar3 - 3)) == 0x2e2f) {
        return false;
      }
    }
    local_38 = (short *)local_58._M_str;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_58,"/../",0,4);
    if (sVar2 != 0xffffffffffffffff) {
      return false;
    }
    local_58._M_len = (size_t)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar6,pcVar6 + sVar4);
    std::__cxx11::string::operator=((string *)result,(string *)&local_58);
    if ((long *)local_58._M_len != local_48) {
      operator_delete((void *)local_58._M_len,local_48[0] + 1);
    }
    if (result->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)result);
    }
    local_58._M_len = (size_t)local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,local_38,(char *)((long)__s1 + uVar3));
    std::__cxx11::string::_M_append((char *)result,local_58._M_len);
  }
  if ((long *)local_58._M_len == local_48) {
    return true;
  }
LAB_001fbd00:
  operator_delete((void *)local_58._M_len,local_48[0] + 1);
  return true;
}

Assistant:

static bool ApplyMapping(absl::string_view filename,
                         absl::string_view old_prefix,
                         absl::string_view new_prefix, std::string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (absl::StartsWith(filename, "/") || IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(std::string(new_prefix));
    if (!result->empty()) result->push_back('/');
    result->append(std::string(filename));
    return true;
  } else if (absl::StartsWith(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = std::string(new_prefix);
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        absl::string_view after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(std::string(new_prefix));
        if (!result->empty()) result->push_back('/');
        result->append(std::string(after_prefix));
        return true;
      }
    }
  }

  return false;
}